

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::puconversion::knownConversions(double val,unit_data *start,unit_data *result)

{
  bool bVar1;
  unit_data *in_RSI;
  unit_data *in_RDI;
  double in_XMM0_Qa;
  unit_data *in_stack_ffffffffffffff78;
  unit_data *in_stack_ffffffffffffff80;
  bool local_51;
  
  unit::base_units((unit *)&puOhm);
  bVar1 = units::detail::unit_data::has_same_base
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    unit::base_units((unit *)&puMW);
    bVar1 = units::detail::unit_data::has_same_base
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_51 = true;
    if (!bVar1) {
      unit::base_units((unit *)&puA);
      local_51 = units::detail::unit_data::has_same_base
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    if (local_51 != false) {
      return 1.0 / in_XMM0_Qa;
    }
  }
  else {
    unit::base_units((unit *)&puA);
    bVar1 = units::detail::unit_data::has_same_base
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      unit::base_units((unit *)&puMW);
      bVar1 = units::detail::unit_data::has_same_base
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (bVar1) {
        return in_XMM0_Qa;
      }
      unit::base_units((unit *)&puOhm);
      bVar1 = units::detail::unit_data::has_same_base(in_RSI,in_stack_ffffffffffffff78);
      if (bVar1) {
        return 1.0 / in_XMM0_Qa;
      }
    }
    else {
      unit::base_units((unit *)&puMW);
      bVar1 = units::detail::unit_data::has_same_base(in_stack_ffffffffffffff80,in_RDI);
      if (bVar1) {
        unit::base_units((unit *)&puA);
        bVar1 = units::detail::unit_data::has_same_base(in_stack_ffffffffffffff80,in_RDI);
        if (bVar1) {
          return in_XMM0_Qa;
        }
        unit::base_units((unit *)&puOhm);
        bVar1 = units::detail::unit_data::has_same_base(in_stack_ffffffffffffff80,in_RDI);
        if (bVar1) {
          return 1.0 / in_XMM0_Qa;
        }
      }
    }
  }
  return NAN;
}

Assistant:

inline double knownConversions(
        double val,
        const detail::unit_data& start,
        const detail::unit_data& result)
    {
        if (start.has_same_base(puOhm.base_units())) {
            if (result.has_same_base(puMW.base_units()) ||
                result.has_same_base(puA.base_units())) {  // V^2/R assuming
                                                           // voltage=1.0 pu; or
                                                           // //I=V/R
                return 1.0 / val;
            }
        } else if (start.has_same_base(puA.base_units())) {
            if (result.has_same_base(puMW.base_units())) {  // P=IV assuming
                                                            // voltage=1.0 pu or
                                                            // //R=V/I
                return val;
            }
            if (result.has_same_base(
                    puOhm.base_units())) {  // P=IV assuming
                                            // voltage=1.0 pu or
                                            // //R=V/I
                return 1.0 / val;
            }
        } else if (start.has_same_base(
                       puMW.base_units())) {  // P=IV, or P=V^2/R
            if (result.has_same_base(
                    puA.base_units())) {  // IV assuming voltage=1.0 pu or
                return val;
            }
            if (result.has_same_base(puOhm.base_units())) {
                return 1.0 / val;
            }
        }
        return constants::invalid_conversion;
    }